

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)>::
UntypedPerformAction
          (FunctionMockerBase<test_result_(fmt::v5::basic_string_view<wchar_t>)> *this,
          void *untyped_action,void *untyped_args)

{
  ActionResultHolder<test_result> *pAVar1;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *in_RDX;
  ArgumentTuple *args;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> action;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *in_stack_ffffffffffffffa8;
  ArgumentTuple *in_stack_ffffffffffffffc8;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> local_28;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *local_18;
  
  local_18 = in_RDX;
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)>::Action
            (&local_28,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<test_result>::
           PerformAction<test_result(fmt::v5::basic_string_view<wchar_t>)>
                     (local_18,in_stack_ffffffffffffffc8);
  Action<test_result_(fmt::v5::basic_string_view<wchar_t>)>::~Action
            ((Action<test_result_(fmt::v5::basic_string_view<wchar_t>)> *)0x17d151);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }